

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::set_mount_point(Server *this,string *mount_point,string *dir,Headers *headers)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  value_type *__x;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  string mnt;
  MountPointEntry *this_00;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  string local_b0 [64];
  _Base_ptr in_stack_ffffffffffffff90;
  allocator<char> local_49;
  string local_48 [40];
  string *local_20;
  string *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = detail::is_dir((string *)in_stack_ffffffffffffff90);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::string(local_48,local_18);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::allocator<char>::~allocator(&local_49);
    }
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar3 == '/')) {
      __x = (value_type *)(in_RDI + 0x80);
      this_00 = (MountPointEntry *)&stack0xffffffffffffff30;
      std::__cxx11::string::string((string *)this_00,local_48);
      std::__cxx11::string::string(local_b0,local_20);
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00,
                 (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)__x);
      std::
      vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>::
      push_back((vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
                 *)this_00,__x);
      MountPointEntry::~MountPointEntry(this_00);
      local_1 = 1;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string(local_48);
    if (bVar1) goto LAB_0019c417;
  }
  local_1 = 0;
LAB_0019c417:
  return (bool)(local_1 & 1);
}

Assistant:

inline bool Server::set_mount_point(const std::string &mount_point,
                                    const std::string &dir, Headers headers) {
  if (detail::is_dir(dir)) {
    std::string mnt = !mount_point.empty() ? mount_point : "/";
    if (!mnt.empty() && mnt[0] == '/') {
      base_dirs_.push_back({mnt, dir, std::move(headers)});
      return true;
    }
  }
  return false;
}